

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

int m256v_LU_decomp_inplace(m256v *A,int *rp,int *cp)

{
  uint8_t uVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  uint8_t Lji;
  int j;
  uint8_t Uii_inv;
  int SwapInt__swval_1;
  int SwapInt__swval;
  int pcol;
  int prow;
  int i;
  int in_stack_00000044;
  m256v *in_stack_00000048;
  uint8_t in_stack_00000057;
  int in_stack_00000058;
  int in_stack_0000005c;
  m256v *in_stack_00000060;
  uint3 uVar3;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  int iVar5;
  
  for (iVar4 = 0; iVar4 < *in_RDI; iVar4 = iVar4 + 1) {
    *(int *)(in_RSI + (long)iVar4 * 4) = iVar4;
  }
  for (iVar4 = 0; iVar4 < in_RDI[1]; iVar4 = iVar4 + 1) {
    *(int *)(in_RDX + (long)iVar4 * 4) = iVar4;
  }
  iVar4 = 0;
  do {
    uVar3 = (uint3)(ushort)in_stack_ffffffffffffffc8;
    if (iVar4 < in_RDI[1]) {
      uVar3 = CONCAT12(iVar4 < *in_RDI,(ushort)in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = CONCAT13((char)((uint)in_stack_ffffffffffffffc8 >> 0x18),uVar3);
    iVar2 = iVar4;
    if ((char)(uVar3 >> 0x10) == '\0') {
      return iVar4;
    }
LAB_00103bbd:
    iVar5 = iVar2;
    if (in_RDI[1] <= iVar4) {
      return iVar2;
    }
    while( true ) {
      if (*in_RDI <= iVar2) goto LAB_00103c0d;
      uVar1 = m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (uVar1 != '\0') break;
      iVar2 = iVar2 + 1;
    }
    if (iVar2 != iVar5) {
      in_stack_ffffffffffffffd8 = *(int *)(in_RSI + (long)iVar2 * 4);
      *(undefined4 *)(in_RSI + (long)iVar2 * 4) = *(undefined4 *)(in_RSI + (long)iVar5 * 4);
      *(int *)(in_RSI + (long)iVar5 * 4) = in_stack_ffffffffffffffd8;
      m256v_swap_rows((m256v *)CONCAT44(iVar5,iVar2),iVar4,in_stack_ffffffffffffffd8);
    }
    if (iVar4 != iVar5) {
      in_stack_ffffffffffffffd4 = *(undefined4 *)(in_RDX + (long)iVar4 * 4);
      *(undefined4 *)(in_RDX + (long)iVar4 * 4) = *(undefined4 *)(in_RDX + (long)iVar5 * 4);
      *(undefined4 *)(in_RDX + (long)iVar5 * 4) = in_stack_ffffffffffffffd4;
      m256v_swap_cols((m256v *)CONCAT44(iVar5,iVar2),iVar4,in_stack_ffffffffffffffd8);
    }
    m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    uVar1 = gf256_inv('\0');
    in_stack_ffffffffffffffd0 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffd0);
    m256v_mult_col_from((m256v *)CONCAT44(iVar5,iVar2),iVar4,in_stack_ffffffffffffffd8,
                        (uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18));
    in_stack_ffffffffffffffcc = iVar5;
    while (in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1,
          in_stack_ffffffffffffffcc < *in_RDI) {
      uVar1 = m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffc8 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffc8);
      m256v_multadd_row_from
                (in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000057,
                 in_stack_00000048,in_stack_00000044);
    }
    iVar4 = iVar5 + 1;
  } while( true );
LAB_00103c0d:
  iVar4 = iVar4 + 1;
  iVar2 = iVar5;
  goto LAB_00103bbd;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}